

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3EvalTokenCosts(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3Expr *pExpr,Fts3TokenAndCost **ppTC,
                       Fts3Expr ***ppOr,int *pRc)

{
  int iVar1;
  Fts3MultiSegReader *pFVar2;
  Fts3SegReader *pFVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Fts3Expr ***pnLoad;
  long iBlockid;
  long lVar7;
  int local_74;
  Fts3Cursor *local_70;
  Fts3PhraseToken *local_68;
  Fts3Phrase *local_60;
  Fts3TokenAndCost **local_58;
  int *local_50;
  Fts3TokenAndCost *local_48;
  long local_40;
  Fts3Table *local_38;
  
  pnLoad = ppOr;
  do {
    if (*pRc != 0) {
      return;
    }
    iVar6 = pExpr->eType;
    if (iVar6 == 4) {
      pRoot = pExpr->pLeft;
      **ppOr = pRoot;
      *ppOr = *ppOr + 1;
    }
    else {
      if (iVar6 == 2) {
        return;
      }
      if (iVar6 == 5) {
        if (*pRc != 0) {
          return;
        }
        local_60 = pExpr->pPhrase;
        local_68 = local_60->aToken;
        local_40 = 0;
        local_70 = pCsr;
        local_58 = ppTC;
        local_50 = pRc;
        do {
          if (local_60->nToken <= local_40) {
            return;
          }
          local_48 = *local_58;
          *local_58 = local_48 + 1;
          local_48->pPhrase = local_60;
          local_48->iToken = (int)local_40;
          local_48->pRoot = pRoot;
          local_48->pToken = local_68 + local_40;
          local_48->iCol = local_60->iColumn;
          pFVar2 = local_68[local_40].pSegcsr;
          if (pFVar2->nSegment < 1) {
            iVar5 = 0;
            iVar6 = 0;
          }
          else {
            local_38 = (Fts3Table *)(local_70->base).pVtab;
            iVar1 = local_38->nPgsz;
            iVar6 = 0;
            lVar7 = 0;
            do {
              pFVar3 = pFVar2->apSegment[lVar7];
              if ((pFVar3->ppNextElem == (Fts3HashElem **)0x0) && (pFVar3->rootOnly == '\0')) {
                iVar5 = 0;
                iBlockid = pFVar3->iStartBlock;
                if (pFVar3->iStartBlock <= pFVar3->iLeafEndBlock) {
                  do {
                    iVar5 = sqlite3Fts3ReadBlock
                                      (local_38,iBlockid,(char **)0x0,&local_74,(int *)pnLoad);
                    if ((iVar5 == 0) && (iVar1 < local_74 + 0x23)) {
                      iVar6 = iVar6 + (local_74 + 0x22) / iVar1;
                    }
                  } while ((iVar5 == 0) &&
                          (bVar4 = iBlockid < pFVar3->iLeafEndBlock, iBlockid = iBlockid + 1, bVar4)
                          );
                }
              }
              else {
                iVar5 = 0;
              }
            } while ((iVar5 == 0) && (lVar7 = lVar7 + 1, lVar7 < pFVar2->nSegment));
          }
          local_48->nOvfl = iVar6;
          *local_50 = iVar5;
          local_40 = local_40 + 1;
        } while (iVar5 == 0);
        return;
      }
    }
    pnLoad = ppOr;
    fts3EvalTokenCosts(pCsr,pRoot,pExpr->pLeft,ppTC,ppOr,pRc);
    if (pExpr->eType == 4) {
      pRoot = pExpr->pRight;
      **ppOr = pRoot;
      *ppOr = *ppOr + 1;
    }
    pExpr = pExpr->pRight;
  } while( true );
}

Assistant:

static void fts3EvalTokenCosts(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Root of current AND/NEAR cluster */
  Fts3Expr *pExpr,                /* Expression to consider */
  Fts3TokenAndCost **ppTC,        /* Write new entries to *(*ppTC)++ */
  Fts3Expr ***ppOr,               /* Write new OR root to *(*ppOr)++ */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      Fts3Phrase *pPhrase = pExpr->pPhrase;
      int i;
      for(i=0; *pRc==SQLITE_OK && i<pPhrase->nToken; i++){
        Fts3TokenAndCost *pTC = (*ppTC)++;
        pTC->pPhrase = pPhrase;
        pTC->iToken = i;
        pTC->pRoot = pRoot;
        pTC->pToken = &pPhrase->aToken[i];
        pTC->iCol = pPhrase->iColumn;
        *pRc = sqlite3Fts3MsrOvfl(pCsr, pTC->pToken->pSegcsr, &pTC->nOvfl);
      }
    }else if( pExpr->eType!=FTSQUERY_NOT ){
      assert( pExpr->eType==FTSQUERY_OR
           || pExpr->eType==FTSQUERY_AND
           || pExpr->eType==FTSQUERY_NEAR
      );
      assert( pExpr->pLeft && pExpr->pRight );
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pLeft;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pLeft, ppTC, ppOr, pRc);
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pRight;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pRight, ppTC, ppOr, pRc);
    }
  }
}